

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-caps.c
# Opt level: O3

int lws_plat_drop_app_privileges(lws_context *context,int actually_drop)

{
  uint __gid;
  int iVar1;
  group *pgVar2;
  passwd *ppVar3;
  int *piVar4;
  char *pcVar5;
  char *format;
  int filter;
  
  if (context->groupname != (char *)0x0) {
    pgVar2 = getgrnam(context->groupname);
    pcVar5 = context->groupname;
    if (pgVar2 != (group *)0x0) {
      _lws_log(8,"%s: group %s -> gid %u\n","lws_plat_drop_app_privileges",pcVar5,
               (ulong)pgVar2->gr_gid);
      context->gid = pgVar2->gr_gid;
      goto LAB_00132220;
    }
    format = "%s: unknown groupname \'%s\'\n";
LAB_001322e1:
    iVar1 = 1;
    filter = 1;
    goto LAB_001322f2;
  }
LAB_00132220:
  if (context->username != (char *)0x0) {
    ppVar3 = getpwnam(context->username);
    if (ppVar3 == (passwd *)0x0) {
      pcVar5 = context->username;
      format = "%s: unknown username %s\n";
      goto LAB_001322e1;
    }
    context->uid = ppVar3->pw_uid;
    _lws_log(8,"%s: username %s -> uid %u\n","lws_plat_drop_app_privileges",context->username);
  }
  if (actually_drop == 0) {
    return 0;
  }
  if (context->gid + 1U < 2) {
    _lws_log(8,"%s: not changing group\n","lws_plat_drop_app_privileges");
LAB_00132296:
    if (context->uid + 1U < 2) {
      _lws_log(8,"%s: not changing user\n","lws_plat_drop_app_privileges");
      return 0;
    }
    ppVar3 = getpwuid(context->uid);
    if (ppVar3 == (passwd *)0x0) {
      __gid = context->uid;
      pcVar5 = "%s: getpwuid: unable to find uid %d\n";
LAB_001323ab:
      _lws_log(1,pcVar5,"lws_plat_drop_app_privileges",(ulong)__gid);
      return 1;
    }
    initgroups(ppVar3->pw_name,context->gid);
    iVar1 = setuid(context->uid);
    if (iVar1 == 0) {
      pcVar5 = ppVar3->pw_name;
      format = "%s: effective user \'%s\'\n";
      iVar1 = 0;
      filter = 4;
      goto LAB_001322f2;
    }
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    format = "%s: setuid: %s failed\n";
  }
  else {
    pgVar2 = getgrgid(context->gid);
    __gid = context->gid;
    if (pgVar2 == (group *)0x0) {
      pcVar5 = "%s: cannot find name for gid %d\n";
      goto LAB_001323ab;
    }
    iVar1 = setgid(__gid);
    if (iVar1 == 0) {
      _lws_log(4,"%s: effective group \'%s\'\n","lws_plat_drop_app_privileges",pgVar2->gr_name);
      goto LAB_00132296;
    }
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    format = "%s: setgid: %s failed\n";
  }
  iVar1 = 1;
  filter = 1;
LAB_001322f2:
  _lws_log(filter,format,"lws_plat_drop_app_privileges",pcVar5);
  return iVar1;
}

Assistant:

int
lws_plat_drop_app_privileges(struct lws_context *context, int actually_drop)
{
	struct passwd *p;
	struct group *g;

	/* if he gave us the groupname, align gid to match it */

	if (context->groupname) {
		g = getgrnam(context->groupname);

		if (g) {
			lwsl_info("%s: group %s -> gid %u\n", __func__,
				  context->groupname, g->gr_gid);
			context->gid = g->gr_gid;
		} else {
			lwsl_err("%s: unknown groupname '%s'\n", __func__,
				 context->groupname);

			return 1;
		}
	}

	/* if he gave us the username, align uid to match it */

	if (context->username) {
		p = getpwnam(context->username);

		if (p) {
			context->uid = p->pw_uid;

			lwsl_info("%s: username %s -> uid %u\n", __func__,
				  context->username, (unsigned int)p->pw_uid);
		} else {
			lwsl_err("%s: unknown username %s\n", __func__,
				 context->username);

			return 1;
		}
	}

	if (!actually_drop)
		return 0;

	/* if he gave us the gid or we have it from the groupname, set it */

	if (context->gid && context->gid != -1) {
		g = getgrgid(context->gid);

		if (!g) {
			lwsl_err("%s: cannot find name for gid %d\n",
				  __func__, context->gid);

			return 1;
		}

		if (setgid(context->gid)) {
			lwsl_err("%s: setgid: %s failed\n", __func__,
				 strerror(LWS_ERRNO));

			return 1;
		}

		lwsl_notice("%s: effective group '%s'\n", __func__,
			    g->gr_name);
	} else
		lwsl_info("%s: not changing group\n", __func__);


	/* if he gave us the uid or we have it from the username, set it */

	if (context->uid && context->uid != -1) {
		p = getpwuid(context->uid);

		if (!p) {
			lwsl_err("%s: getpwuid: unable to find uid %d\n",
				 __func__, context->uid);
			return 1;
		}

#if defined(LWS_HAVE_SYS_CAPABILITY_H) && defined(LWS_HAVE_LIBCAP)
		_lws_plat_apply_caps(CAP_PERMITTED, context->caps,
				     context->count_caps);
#endif

		initgroups(p->pw_name, context->gid);
		if (setuid(context->uid)) {
			lwsl_err("%s: setuid: %s failed\n", __func__,
				  strerror(LWS_ERRNO));

			return 1;
		} else
			lwsl_notice("%s: effective user '%s'\n",
				    __func__, p->pw_name);

#if defined(LWS_HAVE_SYS_CAPABILITY_H) && defined(LWS_HAVE_LIBCAP)
		_lws_plat_apply_caps(CAP_EFFECTIVE, context->caps,
				     context->count_caps);

		if (context->count_caps) {
			int n;
			for (n = 0; n < context->count_caps; n++)
				lwsl_notice("   RETAINING CAP %d\n",
					    (int)context->caps[n]);
		}
#endif
	} else
		lwsl_info("%s: not changing user\n", __func__);

	return 0;
}